

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

int __thiscall
vkt::pipeline::TestTextureCube::copy(TestTextureCube *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int size;
  TestTextureCube *this_00;
  TestTexture *destTexture;
  DefaultDeleter<vkt::pipeline::TestTexture> local_35 [20];
  undefined1 local_21;
  EVP_PKEY_CTX *local_20;
  TestTextureCube *this_local;
  TextureFormat format_local;
  MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *texture;
  
  local_21 = 0;
  local_20 = dst;
  this_local = (TestTextureCube *)src;
  format_local = (TextureFormat)this;
  this_00 = (TestTextureCube *)operator_new(0x188);
  size = tcu::TextureCube::getSize((TextureCube *)(dst + 0x20));
  TestTextureCube(this_00,(TextureFormat *)&this_local,size);
  de::DefaultDeleter<vkt::pipeline::TestTexture>::DefaultDeleter(local_35);
  de::details::MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
  ::MovePtr((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *)
            this,this_00);
  destTexture = de::details::
                UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                ::operator*((UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                             *)this);
  TestTexture::copyToTexture((TestTexture *)dst,destTexture);
  return (int)this;
}

Assistant:

de::MovePtr<TestTexture> TestTextureCube::copy(const tcu::TextureFormat format) const
{
	DE_ASSERT(!isCompressed());

	de::MovePtr<TestTexture>	texture	(new TestTextureCube(format, m_texture.getSize()));

	copyToTexture(*texture);

	return texture;
}